

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdOutput.hpp
# Opt level: O1

void __thiscall imgtogb::StdOutput::version(StdOutput *this,CmdLineInterface *_cmd)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  long *plVar3;
  
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->basename)._M_dataplus._M_p,
                      (this->basename)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  iVar1 = (*_cmd->_vptr_CmdLineInterface[9])(_cmd);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,*(char **)CONCAT44(extraout_var,iVar1),
                      ((undefined8 *)CONCAT44(extraout_var,iVar1))[1]);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  plVar3 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Written by ",0xb);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->author)._M_dataplus._M_p,
                      (this->author)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

inline void StdOutput::version(TCLAP::CmdLineInterface& _cmd) {
		std::cout << basename << " " << _cmd.getVersion() << std::endl << std::endl;
		std::cout << "Written by " << author << std::endl;
	}